

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::RE::~RE(RE *this)

{
  undefined8 *in_RDI;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    regfree((regex_t *)(in_RDI + 10));
    regfree((regex_t *)(in_RDI + 2));
  }
  free((void *)*in_RDI);
  return;
}

Assistant:

RE::~RE() {
  if (is_valid_) {
    // regfree'ing an invalid regex might crash because the content
    // of the regex is undefined. Since the regex's are essentially
    // the same, one cannot be valid (or invalid) without the other
    // being so too.
    regfree(&partial_regex_);
    regfree(&full_regex_);
  }
  free(const_cast<char*>(pattern_));
}